

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int net_set_non_blocking(NETSOCKET sock)

{
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  unsigned_long mode;
  undefined8 local_30 [4];
  int iStack_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30[0] = 1;
  iStack_10 = (int)((ulong)in_RDI >> 0x20);
  local_c = in_ESI;
  if (-1 < in_RDI) {
    ioctl(iStack_10,0x5421,local_30);
  }
  if (-1 < local_c) {
    ioctl(local_c,0x5421,local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int net_set_non_blocking(NETSOCKET sock)
{
	unsigned long mode = 1;
	if(sock.ipv4sock >= 0)
	{
#if defined(CONF_FAMILY_WINDOWS)
		ioctlsocket(sock.ipv4sock, FIONBIO, (unsigned long *)&mode);
#else
		ioctl(sock.ipv4sock, FIONBIO, (unsigned long *)&mode);
#endif
	}

	if(sock.ipv6sock >= 0)
	{
#if defined(CONF_FAMILY_WINDOWS)
		ioctlsocket(sock.ipv6sock, FIONBIO, (unsigned long *)&mode);
#else
		ioctl(sock.ipv6sock, FIONBIO, (unsigned long *)&mode);
#endif
	}

	return 0;
}